

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regfileparser.cpp
# Opt level: O1

bool ProcessRegFile(string *filename,regkeymaker *mk)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  string valuespec;
  string line;
  string valuename;
  string local_c8;
  string local_a8;
  FILE *local_88;
  regkeymaker *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  RegistryValue local_50;
  
  local_80 = mk;
  local_88 = fopen((filename->_M_dataplus)._M_p,"r");
  if (local_88 == (FILE *)0x0) {
    perror((filename->_M_dataplus)._M_p);
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
LAB_001196d4:
    bVar1 = ReadLine((FILE *)local_88,&local_a8);
    if (bVar1) {
      while ((sVar4 = local_a8._M_string_length, local_a8._M_string_length != 0 &&
             (iVar2 = isspace((int)local_a8._M_dataplus._M_p[local_a8._M_string_length - 1]),
             iVar2 != 0))) {
        std::__cxx11::string::resize((ulong)&local_a8,(char)sVar4 + -1);
      }
      stripbom(&local_a8);
      if (((local_a8._M_string_length != 0) &&
          (iVar2 = std::__cxx11::string::compare((char *)&local_a8), iVar2 != 0)) &&
         (*local_a8._M_dataplus._M_p != ';')) {
        if ((*local_a8._M_dataplus._M_p == '[') &&
           (local_a8._M_dataplus._M_p[local_a8._M_string_length - 1] == ']')) {
          std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a8);
          RegistryPath::FromKeySpec((RegistryPath *)&local_78,&local_c8);
          (**local_80->_vptr_regkeymaker)(local_80,(RegistryPath *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_p != &local_60) {
            operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_001196d4;
          sVar4 = CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                           local_c8.field_2._M_local_buf[0]);
          _Var5._M_p = local_c8._M_dataplus._M_p;
        }
        else {
          std::__cxx11::string::find_first_not_of((char *)&local_a8,0x12c8f1,0);
          std::__cxx11::string::erase((ulong)&local_a8,0);
          GetNameFromSetSpec((string *)&local_78,&local_a8,0);
          do {
            if (local_a8._M_string_length == 0) {
              uVar3 = std::__throw_out_of_range_fmt
                                (
                                "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_p != &local_60) {
                operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,
                                CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                         local_c8.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,
                                CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                         local_a8.field_2._M_local_buf[0]) + 1);
              }
              _Unwind_Resume(uVar3);
            }
            if (local_a8._M_dataplus._M_p[local_a8._M_string_length - 1] != ',') {
              if (local_a8._M_dataplus._M_p[local_a8._M_string_length - 1] != '\\') break;
              std::__cxx11::string::resize((ulong)&local_a8,(char)(local_a8._M_string_length - 1));
              while ((sVar4 = local_a8._M_string_length, local_a8._M_string_length != 0 &&
                     (iVar2 = isspace((int)local_a8._M_dataplus._M_p[local_a8._M_string_length - 1])
                     , iVar2 != 0))) {
                std::__cxx11::string::resize((ulong)&local_a8,(char)sVar4 + -1);
              }
            }
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            local_c8._M_string_length = 0;
            local_c8.field_2._M_local_buf[0] = '\0';
            bVar1 = ReadLine((FILE *)local_88,&local_c8);
            if (bVar1) {
              std::__cxx11::string::find_first_not_of((char *)&local_c8,0x12c8f1,0);
              std::__cxx11::string::erase((ulong)&local_c8,0);
              while ((sVar4 = local_c8._M_string_length, local_c8._M_string_length != 0 &&
                     (iVar2 = isspace((int)local_c8._M_dataplus._M_p[local_c8._M_string_length - 1])
                     , iVar2 != 0))) {
                std::__cxx11::string::resize((ulong)&local_c8,(char)sVar4 + -1);
              }
              std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,
                              CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                       local_c8.field_2._M_local_buf[0]) + 1);
            }
          } while (bVar1);
          GetValueSpecFromSetSpec(&local_c8,&local_a8,0);
          RegistryValue::FromValueSpec(&local_50,&local_c8);
          (*local_80->_vptr_regkeymaker[1])(local_80,(RegistryPath *)&local_78,&local_50);
          if (local_50.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_50.m_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_50.m_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,
                            CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                     local_c8.field_2._M_local_buf[0]) + 1);
          }
          sVar4 = local_68;
          _Var5._M_p = (pointer)local_78;
          if (local_78 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_68) goto LAB_001196d4;
        }
        operator_delete(_Var5._M_p,sVar4 + 1);
      }
      goto LAB_001196d4;
    }
    fclose(local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
  }
  return local_88 != (FILE *)0x0;
}

Assistant:

bool ProcessRegFile(const std::string& filename, regkeymaker& mk)
{
    FILE *f= fopen(filename.c_str(), "r");
    if (f==NULL) {
        perror(filename.c_str());
        return false;
    }

    std::string line;

// note: not yet handling linecontinuations
// note: not yet handling utf-16LE encoded files
    while (ReadLine(f, line)) {
        // remove trailing whitespace
        while (line.size() && isspace(line[line.size()-1])) {
            line.resize(line.size()-1);
        }

        stripbom(line);

        if (line.size()==0)
            continue;
        else if (line=="REGEDIT4")
            continue;
        else if (line[0]=='[' && line[line.size()-1]==']') {
            mk.newkey(RegistryPath::FromKeySpec(line.substr(1, line.size()-2)));
        }
        else if (line[0]==';') {
            // skip comments.
        }
        else {
            // remove leading whitespace
            line.erase(0, line.find_first_not_of(" \t"));

            std::string valuename= GetNameFromSetSpec(line, 0);

            // note: not handling comments here: comment ending in ',' will confuse us.

            // handle line continuation
            while (line.at(line.size()-1)=='\\' || line.at(line.size()-1)==',' ) {
                // strip  backslash + whitespace
                if (line.at(line.size()-1)=='\\') {
                    line.resize(line.size()-1);
                    while (line.size() && isspace(line[line.size()-1])) {
                        line.resize(line.size()-1);
                    }
                }
                std::string continuedline;
                if (!ReadLine(f, continuedline))
                    break;
                // trim whitespace
                continuedline.erase(0, continuedline.find_first_not_of(" \t"));
                while (continuedline.size() && isspace(continuedline[continuedline.size()-1])) {
                    continuedline.resize(continuedline.size()-1);
                }

                line += continuedline;
            }
            std::string valuespec= GetValueSpecFromSetSpec(line, 0);

            //debug("valline: %hs  = %hs\n", valuename.c_str(), valuespec.c_str());

            mk.setval(valuename, RegistryValue::FromValueSpec(valuespec));
        }
    }

    fclose(f);
    return true;
}